

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyDiscrete.cpp
# Opt level: O2

void __thiscall
JointPolicyDiscrete::SampleJointActionVector
          (JointPolicyDiscrete *this,Index i,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sampled_aIs)

{
  int iVar1;
  Interface_ProblemToPolicyDiscrete *pIVar2;
  undefined4 extraout_var;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indivDomIndices;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> _Stack_38;
  
  pIVar2 = GetInterfacePTPDiscrete(this);
  iVar1 = (*pIVar2->_vptr_Interface_ProblemToPolicyDiscrete[2])(pIVar2,(ulong)this->_m_indexDomCat);
  if ((char)iVar1 != '\0') {
    pIVar2 = GetInterfacePTPDiscrete(this);
    iVar1 = (*pIVar2->_vptr_Interface_ProblemToPolicyDiscrete[10])
                      (pIVar2,i,(ulong)this->_m_indexDomCat);
    SampleJointActionVector
              (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    CONCAT44(extraout_var,iVar1),sampled_aIs);
    return;
  }
  pIVar2 = GetInterfacePTPDiscrete(this);
  (*pIVar2->_vptr_Interface_ProblemToPolicyDiscrete[9])
            (&_Stack_38,pIVar2,i,(ulong)this->_m_indexDomCat);
  SampleJointActionVector
            (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_38,sampled_aIs);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&_Stack_38);
  return;
}

Assistant:

void
JointPolicyDiscrete::SampleJointActionVector( Index i, 
       vector<Index>& sampled_aIs ) const
{

    if( GetInterfacePTPDiscrete()->AreCachedJointToIndivIndices(_m_indexDomCat) )
    {
        const vector<Index>& indivDomIndices = GetInterfacePTPDiscrete()->
            JointToIndividualPolicyDomainIndicesRef (i, _m_indexDomCat);
        return( SampleJointActionVector( indivDomIndices, sampled_aIs) );
    }
    else
    {
        vector<Index> indivDomIndices = GetInterfacePTPDiscrete()->    
            JointToIndividualPolicyDomainIndices(i, _m_indexDomCat);
        return( SampleJointActionVector( indivDomIndices, sampled_aIs) );
    }
            
}